

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_shared.c
# Opt level: O2

int32_t apx_fileManagerShared_get_num_local_files(apx_fileManagerShared_t *self)

{
  int32_t iVar1;
  
  if (self != (apx_fileManagerShared_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    iVar1 = apx_fileMap_length(&self->local_file_map);
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
    return iVar1;
  }
  return -1;
}

Assistant:

int32_t apx_fileManagerShared_get_num_local_files(apx_fileManagerShared_t* self)
{
   if (self != NULL)
   {
      int32_t retval;
      MUTEX_LOCK(self->lock);
      retval = apx_fileMap_length(&self->local_file_map);
      MUTEX_UNLOCK(self->lock);
      return retval;
   }
   return -1;
}